

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O1

void __thiscall qpdf::Tokenizer::inName(Tokenizer *this,char ch)

{
  bool bVar1;
  
  bVar1 = isDelimiter(this,ch);
  if (bVar1) {
    this->type = (this->bad ^ 1) << 3;
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
  }
  else {
    if (ch != '#') {
      std::__cxx11::string::push_back((char)this + '\x10');
      return;
    }
    this->char_code = 0;
    this->state = st_name_hex1;
  }
  return;
}

Assistant:

void
Tokenizer::inName(char ch)
{
    if (isDelimiter(ch)) {
        // A C-locale whitespace character or delimiter terminates token.  It is important to unread
        // the whitespace character even though it is ignored since it may be the newline after a
        // stream keyword.  Removing it here could make the stream-reading code break on some files,
        // though not on any files in the test suite as of this
        // writing.

        type = bad ? tt::tt_bad : tt::tt_name;
        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
    } else if (ch == '#') {
        char_code = 0;
        state = st_name_hex1;
    } else {
        val += ch;
    }
}